

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_compress.c
# Opt level: O0

void test_write_filter_compress(void)

{
  wchar_t wVar1;
  void *__ptr;
  void *__s;
  archive_entry *v2;
  archive *v2_00;
  int i;
  size_t used;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff78;
  archive_entry *paVar2;
  archive *paVar3;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  wchar_t in_stack_ffffffffffffff88;
  wchar_t in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  wchar_t line;
  archive *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar4;
  void *in_stack_ffffffffffffffb0;
  char local_48 [8];
  void *in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc8;
  archive_entry *local_8;
  
  __ptr = malloc(1000000);
  assertion_assert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  __s = malloc(10000);
  assertion_assert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  memset(__s,0,10000);
  v2 = (archive_entry *)archive_write_new();
  assertion_assert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  archive_write_set_format_ustar
            ((archive *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1d799e,in_stack_ffffffffffffffb0);
  archive_write_add_filter_compress
            ((archive *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1d79d7,in_stack_ffffffffffffffb0);
  archive_write_open_memory
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (size_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  paVar2 = v2;
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1d7a1f,in_stack_ffffffffffffffb0);
  for (uVar4 = 0; (int)uVar4 < 100; uVar4 = uVar4 + 1) {
    sprintf(local_48,"file%03d",(ulong)uVar4);
    local_8 = archive_entry_new();
    assertion_assert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar2);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)paVar2);
    archive_entry_set_size(local_8,10000);
    archive_entry_set_filetype(local_8,0x8000);
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar2);
    paVar2 = v2;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (longlong)v2,(char *)0x1d7af6,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffa0 = 0;
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       paVar2,0x1d7b14);
    paVar2 = (archive_entry *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                        (char *)0x1d7b45,in_stack_ffffffffffffffb0);
    archive_entry_free((archive_entry *)0x1d7b52);
  }
  archive_write_close((archive *)0x1d7b6c);
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1d7b9b,in_stack_ffffffffffffffb0);
  archive_write_free((archive *)0x1d7ba5);
  paVar3 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                      (char *)0x1d7bd3,in_stack_ffffffffffffffb0);
  v2_00 = archive_read_new();
  assertion_assert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar3);
  archive_read_support_format_all(paVar3);
  paVar3 = v2_00;
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2_00,(char *)0x1d7c3f,in_stack_ffffffffffffffb0);
  archive_read_support_filter_all(paVar3);
  paVar3 = v2_00;
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2_00,(char *)0x1d7c78,in_stack_ffffffffffffffb0);
  archive_read_open_memory
            ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar3,
             0x1d7c8c);
  paVar3 = v2_00;
  assertion_equal_int((char *)in_stack_ffffffffffffff98,
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2_00,(char *)0x1d7cbb,in_stack_ffffffffffffffb0);
  for (uVar4 = 0; line = (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20), (int)uVar4 < 100;
      uVar4 = uVar4 + 1) {
    sprintf(local_48,"file%03d",(ulong)uVar4);
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (archive_entry **)paVar3);
    paVar2 = (archive_entry *)0x0;
    wVar1 = assertion_equal_int((char *)in_stack_ffffffffffffff98,line,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                ),0,(char *)0x1d7d25,in_stack_ffffffffffffffb0);
    if (wVar1 == L'\0') break;
    in_stack_ffffffffffffff90 = local_48;
    archive_entry_pathname(paVar2);
    in_stack_ffffffffffffff80 = 0;
    assertion_equal_string
              ((char *)CONCAT44(uVar4,in_stack_ffffffffffffffa8),
               (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(char *)in_stack_ffffffffffffff98
               ,in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char *)((ulong)in_stack_ffffffffffffff84 << 0x20),in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffff98 = (archive *)0x2710;
    archive_entry_size(local_8);
    paVar3 = (archive *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                        (char *)0x1d7dcb,in_stack_ffffffffffffffb0);
  }
  archive_read_close((archive *)0x1d7de5);
  assertion_equal_int((char *)in_stack_ffffffffffffff98,line,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2_00,(char *)0x1d7e14,in_stack_ffffffffffffffb0);
  archive_read_free((archive *)0x1d7e1e);
  assertion_equal_int((char *)in_stack_ffffffffffffff98,line,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                      (char *)0x1d7e4c,in_stack_ffffffffffffffb0);
  free(__s);
  free(__ptr);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_compress)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used;
	int i;

	buffsize = 1000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	memset(data, 0, datasize);

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_compress(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertEqualInt(datasize,
		    archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));


	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(data);
	free(buff);
}